

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# r_defs.h
# Opt level: O0

FUDMFKey * __thiscall FUDMFKey::operator=(FUDMFKey *this,double val)

{
  double val_local;
  FUDMFKey *this_local;
  
  this->Type = 1;
  this->IntVal = (int)val;
  this->FloatVal = val;
  FString::operator=(&this->StringVal,"");
  return this;
}

Assistant:

FUDMFKey& operator =(double val)
	{
		Type = UDMF_Float;
		IntVal = int(val);
		FloatVal = val;
		StringVal = "";
		return *this;
	}